

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O3

void __thiscall
asio::ssl::context::set_verify_callback<asio::ssl::rfc2818_verification>
          (context *this,rfc2818_verification *callback)

{
  pointer pcVar1;
  error_code __ec;
  error_code ec;
  long *local_70 [2];
  long local_60 [2];
  error_code local_50;
  system_error local_40 [32];
  
  local_50._M_value = 0;
  local_50._M_cat = (error_category *)std::_V2::system_category();
  pcVar1 = (callback->host_)._M_dataplus._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + (callback->host_)._M_string_length);
  set_verify_callback<asio::ssl::rfc2818_verification>
            (this,(rfc2818_verification *)local_70,&local_50);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  __ec._4_4_ = 0;
  __ec._M_value = local_50._M_value;
  if (local_50._M_value != 0) {
    __ec._M_cat = local_50._M_cat;
    std::system_error::system_error(local_40,__ec,"set_verify_callback");
    asio::detail::throw_exception<std::system_error>(local_40);
    std::system_error::~system_error(local_40);
  }
  return;
}

Assistant:

void context::set_verify_callback(VerifyCallback callback)
{
  asio::error_code ec;
  this->set_verify_callback(callback, ec);
  asio::detail::throw_error(ec, "set_verify_callback");
}